

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O1

Var Js::JavascriptNumber::EntryValueOf(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  Var pvVar8;
  JavascriptNumberObject *this;
  RecyclableObject *pRVar9;
  int in_stack_00000010;
  Type local_60;
  Type TStack_58;
  undefined1 auStack_50 [8];
  ArgumentReader args;
  Var result;
  CallInfo callInfo_local;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  result = (Var)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != (int)result) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x37c,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00ced0e0;
    *puVar7 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  auStack_50 = (undefined1  [8])result;
  ArgumentReader::AdjustArguments((ArgumentReader *)auStack_50,(CallInfo *)&result);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pvVar8 = Arguments::operator[]((Arguments *)auStack_50,0);
  if (((ulong)result & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x380,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00ced0e0;
    *puVar7 = 0;
  }
  if (((ulong)auStack_50 & 0xffffff) != 0) {
    if (((ulong)pvVar8 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00ced0e0;
      *puVar7 = 0;
    }
    if ((ulong)pvVar8 >> 0x32 != 0 || ((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) {
      return pvVar8;
    }
    bVar4 = VarIs<Js::JavascriptNumberObject>(pvVar8);
    if (bVar4) {
      this = VarTo<Js::JavascriptNumberObject>(pvVar8);
      pvVar8 = JavascriptNumberObject::Unwrap(this);
      pvVar8 = CrossSite::MarshalVar
                         (pSVar2,pvVar8,
                          (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                            javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
      ;
      return pvVar8;
    }
    if (pvVar8 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00ced0e0;
      *puVar7 = 0;
    }
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00ced0e0;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar9->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(pRVar9), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00ced0e0;
      *puVar7 = 0;
    }
    if (TVar1 == TypeIds_Int64Number) {
      return pvVar8;
    }
    if (pvVar8 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00ced0e0;
      *puVar7 = 0;
    }
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00ced0e0;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar9->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(pRVar9), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00ced0e0;
      *puVar7 = 0;
    }
    if (TVar1 == TypeIds_LastNumberType) {
      return pvVar8;
    }
    if (pvVar8 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00ced0e0;
      *puVar7 = 0;
    }
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00ced0e0;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar9->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(pRVar9), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) {
LAB_00ced0e0:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    if (TVar1 == TypeIds_HostDispatch) {
      pRVar9 = VarTo<Js::RecyclableObject>(pvVar8);
      local_60._0_4_ = auStack_50._0_4_;
      local_60._4_4_ = auStack_50._4_4_;
      TStack_58._0_4_ = args.super_Arguments.Info._0_4_;
      TStack_58._4_4_ = args.super_Arguments.Info._4_4_;
      iVar6 = (*(pRVar9->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x55])
                        (pRVar9,EntryValueOf,&local_60,&args.super_Arguments.Values);
      if (iVar6 != 0) {
        return args.super_Arguments.Values;
      }
    }
  }
  JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec3c,L"Number.prototype.valueOf");
}

Assistant:

Var JavascriptNumber::EntryValueOf(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        Var value = args[0];

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.valueOf"));
        }

        //avoid creation of a new Number
        if (TaggedInt::Is(value) || JavascriptNumber::Is_NoTaggedIntCheck(value))
        {
            return value;
        }
        else if (VarIs<JavascriptNumberObject>(value))
        {
            JavascriptNumberObject* obj = VarTo<JavascriptNumberObject>(value);
            return CrossSite::MarshalVar(scriptContext, obj->Unwrap(), obj->GetScriptContext());
        }
        else if (Js::JavascriptOperators::GetTypeId(value) == TypeIds_Int64Number)
        {
            return value;
        }
        else if (Js::JavascriptOperators::GetTypeId(value) == TypeIds_UInt64Number)
        {
            return value;
        }
        else
        {
            if (JavascriptOperators::GetTypeId(value) == TypeIds_HostDispatch)
            {
                Var result;
                if (VarTo<RecyclableObject>(value)->InvokeBuiltInOperationRemotely(EntryValueOf, args, &result))
                {
                    return result;
                }
            }

            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.valueOf"));
        }
    }